

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,postfix_expression *e)

{
  wostream *os;
  double dVar1;
  double dVar2;
  value member;
  wostringstream _woss;
  value local_1d0;
  wstring_view local_1a8;
  value local_198 [9];
  
  eval(&local_1d0,this,
       (e->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(local_198,this,&local_1d0);
  dVar1 = to_number(local_198);
  value::destroy(local_198);
  if (e->op_ == plusplus) {
    dVar2 = 1.0;
  }
  else {
    if (e->op_ != minusminus) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
      os = std::operator<<((wostream *)local_198,"Not implemented: ");
      mjs::operator<<(os,e->op_);
      std::__cxx11::wstringbuf::str();
      throw_runtime_error(&local_1a8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                          ,0x265);
    }
    dVar2 = -1.0;
  }
  local_198[0].field_1._0_8_ = dVar2 + dVar1;
  local_198[0].type_ = number;
  put_value(this,&local_1d0,local_198);
  value::destroy(local_198);
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = dVar1;
  value::destroy(&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const postfix_expression& e) {
        auto member = eval(e.e());
        auto orig = to_number(get_value(member));
        auto num = orig;
        switch (e.op()) {
        case token_type::plusplus:   num += 1; break;
        case token_type::minusminus: num -= 1; break;
        default: NOT_IMPLEMENTED(e.op());
        }
        put_value(member, value{num});
        return value{orig};
    }